

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O0

REF_STATUS
ref_part_plt_header(FILE *file,REF_INT *nvar,REF_LIST zone_type,REF_LIST zone_packing,
                   REF_LIST zone_nnode,REF_LIST zone_nelem)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  size_t sVar5;
  double dVar6;
  double local_1700;
  REF_DBL ref_private_status_rwds_allowed;
  REF_DBL ref_private_status_rwds_del;
  REF_DBL ref_private_status_rwds_bd;
  REF_DBL ref_private_status_rwds_ad;
  REF_LONG ref_private_status_reis_bi_27;
  REF_LONG ref_private_status_reis_ai_27;
  REF_LONG ref_private_status_reis_bi_26;
  REF_LONG ref_private_status_reis_ai_26;
  REF_LONG ref_private_status_reis_bi_25;
  REF_LONG ref_private_status_reis_ai_25;
  REF_LONG ref_private_status_reis_bi_24;
  REF_LONG ref_private_status_reis_ai_24;
  REF_LONG ref_private_status_reis_bi_23;
  REF_LONG ref_private_status_reis_ai_23;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_LONG ref_private_status_reis_bi_22;
  REF_LONG ref_private_status_reis_ai_22;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_LONG ref_private_status_reis_bi_21;
  REF_LONG ref_private_status_reis_ai_21;
  REF_LONG ref_private_status_reis_bi_20;
  REF_LONG ref_private_status_reis_ai_20;
  REF_LONG ref_private_status_reis_bi_19;
  REF_LONG ref_private_status_reis_ai_19;
  REF_LONG ref_private_status_reis_bi_18;
  REF_LONG ref_private_status_reis_ai_18;
  REF_LONG ref_private_status_reis_bi_17;
  REF_LONG ref_private_status_reis_ai_17;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_LONG ref_private_status_reis_bi_16;
  REF_LONG ref_private_status_reis_ai_16;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_LONG ref_private_status_reis_bi_15;
  REF_LONG ref_private_status_reis_ai_15;
  REF_LONG ref_private_status_reis_bi_14;
  REF_LONG ref_private_status_reis_ai_14;
  REF_LONG ref_private_status_reis_bi_13;
  REF_LONG ref_private_status_reis_ai_13;
  REF_LONG ref_private_status_reis_bi_12;
  REF_LONG ref_private_status_reis_ai_12;
  REF_LONG ref_private_status_reis_bi_11;
  REF_LONG ref_private_status_reis_ai_11;
  REF_LONG ref_private_status_reis_bi_10;
  REF_LONG ref_private_status_reis_ai_10;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_LONG ref_private_status_reis_bi_9;
  REF_LONG ref_private_status_reis_ai_9;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LONG ref_private_status_reis_bi_8;
  REF_LONG ref_private_status_reis_ai_8;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_BOOL verbose;
  int auxiliary_value_format;
  int aux;
  int dim;
  int numelem;
  int numpts;
  int i;
  int miscellaneous;
  double solutiontime;
  int neighbor;
  int location;
  int packing;
  int zonetype;
  int notused;
  int strand;
  int parent;
  float zonemarker;
  int numvar;
  int var;
  char auxvalue [1024];
  char auxname [1024];
  char zonename [1024];
  char varname [1024];
  char title [1024];
  int local_50;
  int filetype;
  int endian;
  undefined1 local_44;
  char header [9];
  REF_LIST zone_nelem_local;
  REF_LIST zone_nnode_local;
  REF_LIST zone_packing_local;
  REF_LIST zone_type_local;
  REF_INT *nvar_local;
  FILE *file_local;
  
  ref_private_status_reis_ai._0_4_ = 0;
  header._1_8_ = zone_nelem;
  pcVar4 = fgets((char *)((long)&filetype + 3),6,(FILE *)file);
  if ((char *)((long)&filetype + 3) != pcVar4) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x919,
           "ref_part_plt_header","header error");
    return 1;
  }
  local_44 = 0;
  iVar2 = strncmp((char *)((long)&filetype + 3),"#!TDV",5);
  if ((long)iVar2 != 0) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x91b,
           "ref_part_plt_header","header \'#!TDV\' missing",0,(long)iVar2);
    return 1;
  }
  pcVar4 = fgets((char *)((long)&filetype + 3),4,(FILE *)file);
  if ((char *)((long)&filetype + 3) != pcVar4) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x91c,
           "ref_part_plt_header","version error");
    return 1;
  }
  endian._3_1_ = 0;
  iVar2 = strncmp((char *)((long)&filetype + 3),"112",5);
  if ((long)iVar2 != 0) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x91e,
           "ref_part_plt_header","expected version \'112\'",0,(long)iVar2);
    return 1;
  }
  sVar5 = fread(&local_50,4,1,(FILE *)file);
  if (sVar5 != 1) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x920,
           "ref_part_plt_header","magic",1,sVar5);
    return 1;
  }
  if ((long)local_50 != 1) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x921,
           "ref_part_plt_header","expected little endian plt",1,(long)local_50);
    return 1;
  }
  sVar5 = fread(title + 0x3fc,4,1,(FILE *)file);
  if (sVar5 != 1) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x922,
           "ref_part_plt_header","filetype",1,sVar5);
    return 1;
  }
  if ((long)(int)title._1020_4_ != 0) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x923,
           "ref_part_plt_header","expected full filetype",0,(long)(int)title._1020_4_);
    return 1;
  }
  uVar3 = ref_part_plt_string(file,varname + 0x3f8,0x400);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x925,
           "ref_part_plt_header",(ulong)uVar3,"read title");
    return uVar3;
  }
  if ((int)ref_private_status_reis_ai != 0) {
    printf("plt title \'%s\'\n",varname + 0x3f8);
  }
  sVar5 = fread(&parent,4,1,(FILE *)file);
  if (sVar5 != 1) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x928,
           "ref_part_plt_header","numvar",1,sVar5);
    return 1;
  }
  if ((int)ref_private_status_reis_ai != 0) {
    printf("plt number of variables %d\n",(ulong)(uint)parent);
  }
  *nvar = parent;
  for (zonemarker = 0.0; (int)zonemarker < parent; zonemarker = (float)((int)zonemarker + 1)) {
    uVar3 = ref_part_plt_string(file,zonename + 0x3f8,0x400);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x92d,
             "ref_part_plt_header",(ulong)uVar3,"read variable name");
      return uVar3;
    }
    if ((int)ref_private_status_reis_ai != 0) {
      printf("plt variable name %d \'%s\'\n",(ulong)(uint)zonemarker,zonename + 0x3f8);
    }
  }
  sVar5 = fread(&strand,4,1,(FILE *)file);
  if (sVar5 != 1) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x931,
           "ref_part_plt_header","zonemarker",1,sVar5);
    return 1;
  }
  while( true ) {
    if (799.0 - (float)strand <= 0.0) {
      fVar1 = -(799.0 - (float)strand);
    }
    else {
      fVar1 = 799.0 - (float)strand;
    }
    if (1e-07 <= fVar1) break;
    uVar3 = ref_part_plt_string(file,auxvalue + 0x3f8,0x400);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x934,
             "ref_part_plt_header",(ulong)uVar3,"read auxname");
      return uVar3;
    }
    if ((int)ref_private_status_reis_ai != 0) {
      printf("plt auxname \'%s\'\n",auxvalue + 0x3f8);
    }
    sVar5 = fread((void *)((long)&ref_private_status_reis_ai + 4),4,1,(FILE *)file);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x937,
             "ref_part_plt_header","auxiliary_value_format",1,sVar5);
      return 1;
    }
    uVar3 = ref_part_plt_string(file,(char *)&numvar,0x400);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x938,
             "ref_part_plt_header",(ulong)uVar3,"read auxvalue");
      return uVar3;
    }
    if ((int)ref_private_status_reis_ai != 0) {
      printf("plt auxvalue \'%s\'\n",&numvar);
    }
    sVar5 = fread(&strand,4,1,(FILE *)file);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x93a,
             "ref_part_plt_header","zonemarker",1,sVar5);
      return 1;
    }
  }
  while( true ) {
    if (299.0 - (float)strand <= 0.0) {
      fVar1 = -(299.0 - (float)strand);
    }
    else {
      fVar1 = 299.0 - (float)strand;
    }
    if (1e-07 <= fVar1) {
      dVar6 = (double)(float)strand;
      if (357.0 - dVar6 <= 0.0) {
        local_1700 = -(357.0 - dVar6);
      }
      else {
        local_1700 = 357.0 - dVar6;
      }
      if (3.57e-10 < local_1700) {
        printf("%s: %d: %s: %s\nexpected %.15e, was %.15e, %e outside of %e\n",0x4076500000000000,
               dVar6,local_1700,0x3df888691125076a,
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x965,"ref_part_plt_header","end of header marker expected");
        return 1;
      }
      return 0;
    }
    uVar3 = ref_part_plt_string(file,auxname + 0x3f8,0x400);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x93e,
             "ref_part_plt_header",(ulong)uVar3,"read zonename");
      return uVar3;
    }
    if ((int)ref_private_status_reis_ai != 0) {
      printf("plt zonename \'%s\'\n",auxname + 0x3f8);
    }
    sVar5 = fread(&notused,4,1,(FILE *)file);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x941,
             "ref_part_plt_header","parent",1,sVar5);
      return 1;
    }
    sVar5 = fread(&zonetype,4,1,(FILE *)file);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x942,
             "ref_part_plt_header","strand",1,sVar5);
      return 1;
    }
    sVar5 = fread(&i,8,1,(FILE *)file);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x943,
             "ref_part_plt_header","solutiontime",1,sVar5);
      return 1;
    }
    sVar5 = fread(&packing,4,1,(FILE *)file);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x944,
             "ref_part_plt_header","notused",1,sVar5);
      return 1;
    }
    if ((long)packing != -1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x945,
             "ref_part_plt_header","not unused should be -1 plt",0xffffffffffffffff,(long)packing);
      return 1;
    }
    sVar5 = fread(&location,4,1,(FILE *)file);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x946,
             "ref_part_plt_header","zonetype",1,sVar5);
      return 1;
    }
    uVar3 = ref_list_push(zone_type,location);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x947,
             "ref_part_plt_header",(ulong)uVar3,"save zonetype");
      return uVar3;
    }
    sVar5 = fread(&neighbor,4,1,(FILE *)file);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x948,
             "ref_part_plt_header","packing",1,sVar5);
      return 1;
    }
    uVar3 = ref_list_push(zone_packing,neighbor);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x949,
             "ref_part_plt_header",(ulong)uVar3,"save packing");
      return uVar3;
    }
    sVar5 = fread((void *)((long)&solutiontime + 4),4,1,(FILE *)file);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x94a,
             "ref_part_plt_header","location",1,sVar5);
      return 1;
    }
    if ((long)solutiontime._4_4_ != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x94b,
             "ref_part_plt_header","only node data location plt implemented",0,
             (long)solutiontime._4_4_);
      return 1;
    }
    sVar5 = fread(&solutiontime,4,1,(FILE *)file);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x94c,
             "ref_part_plt_header","neighbor",1,sVar5);
      return 1;
    }
    if ((long)solutiontime._0_4_ != 0) break;
    numpts = 0;
    for (numelem = 0; numelem < parent + 1 && numpts == 0; numelem = numelem + 1) {
      sVar5 = fread(&numpts,4,1,(FILE *)file);
      if (sVar5 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x953,"ref_part_plt_header","mystery",1,sVar5);
        return 1;
      }
    }
    dim = numpts;
    uVar3 = ref_list_push(zone_nnode,numpts);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x957,
             "ref_part_plt_header",(ulong)uVar3,"save nnode");
      return uVar3;
    }
    sVar5 = fread(&aux,4,1,(FILE *)file);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x958,
             "ref_part_plt_header","numelem",1,sVar5);
      return 1;
    }
    uVar3 = ref_list_push((REF_LIST)header._1_8_,aux);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x959,
             "ref_part_plt_header",(ulong)uVar3,"save nelem");
      return uVar3;
    }
    for (numelem = 0; numelem < 3; numelem = numelem + 1) {
      sVar5 = fread(&auxiliary_value_format,4,1,(FILE *)file);
      if (sVar5 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x95c,"ref_part_plt_header","dim",1,sVar5);
        return 1;
      }
      if ((long)auxiliary_value_format != 0) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x95d,"ref_part_plt_header","dim nonzero plt",0,(long)auxiliary_value_format);
        return 1;
      }
    }
    sVar5 = fread(&verbose,4,1,(FILE *)file);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x95f,
             "ref_part_plt_header","aux",1,sVar5);
      return 1;
    }
    if ((long)verbose != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x960,
             "ref_part_plt_header","aux nonzero plt",0,(long)verbose);
      return 1;
    }
    sVar5 = fread(&strand,4,1,(FILE *)file);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x962,
             "ref_part_plt_header","zonemarker",1,sVar5);
      return 1;
    }
  }
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x94d,
         "ref_part_plt_header","no face neighbor  plt implemented",0,(long)solutiontime._0_4_);
  return 1;
}

Assistant:

REF_FCN static REF_STATUS ref_part_plt_header(FILE *file, REF_INT *nvar,
                                              REF_LIST zone_type,
                                              REF_LIST zone_packing,
                                              REF_LIST zone_nnode,
                                              REF_LIST zone_nelem) {
  char header[9];
  int endian, filetype;
  char title[1024], varname[1024], zonename[1024];
  char auxname[1024], auxvalue[1024];
  int var, numvar;
  float zonemarker;
  int parent, strand, notused, zonetype, packing, location, neighbor;
  double solutiontime;
  int miscellaneous, i;
  int numpts, numelem;
  int dim, aux, auxiliary_value_format;
  REF_BOOL verbose = REF_FALSE;

  RAS(header == fgets(header, 6, file), "header error");
  header[5] = '\0';
  REIS(0, strncmp(header, "#!TDV", 5), "header '#!TDV' missing")
  RAS(header == fgets(header, 4, file), "version error");
  header[4] = '\0';
  REIS(0, strncmp(header, "112", 5), "expected version '112'")

  REIS(1, fread(&endian, sizeof(int), 1, file), "magic");
  REIS(1, endian, "expected little endian plt");
  REIS(1, fread(&filetype, sizeof(int), 1, file), "filetype");
  REIS(0, filetype, "expected full filetype");

  RSS(ref_part_plt_string(file, title, 1024), "read title");
  if (verbose) printf("plt title '%s'\n", title);

  REIS(1, fread(&numvar, sizeof(int), 1, file), "numvar");
  if (verbose) printf("plt number of variables %d\n", numvar);
  *nvar = numvar;

  for (var = 0; var < numvar; var++) {
    RSS(ref_part_plt_string(file, varname, 1024), "read variable name");
    if (verbose) printf("plt variable name %d '%s'\n", var, varname);
  }

  REIS(1, fread(&zonemarker, sizeof(float), 1, file), "zonemarker");

  while (ABS(799.0 - (double)zonemarker) < 1.0e-7) {
    RSS(ref_part_plt_string(file, auxname, 1024), "read auxname");
    if (verbose) printf("plt auxname '%s'\n", auxname);
    REIS(1, fread(&auxiliary_value_format, sizeof(int), 1, file),
         "auxiliary_value_format");
    RSS(ref_part_plt_string(file, auxvalue, 1024), "read auxvalue");
    if (verbose) printf("plt auxvalue '%s'\n", auxvalue);
    REIS(1, fread(&zonemarker, sizeof(float), 1, file), "zonemarker");
  }

  while (ABS(299.0 - (double)zonemarker) < 1.0e-7) {
    RSS(ref_part_plt_string(file, zonename, 1024), "read zonename");
    if (verbose) printf("plt zonename '%s'\n", zonename);

    REIS(1, fread(&parent, sizeof(int), 1, file), "parent");
    REIS(1, fread(&strand, sizeof(int), 1, file), "strand");
    REIS(1, fread(&solutiontime, sizeof(double), 1, file), "solutiontime");
    REIS(1, fread(&notused, sizeof(int), 1, file), "notused");
    REIS(-1, notused, "not unused should be -1 plt");
    REIS(1, fread(&zonetype, sizeof(int), 1, file), "zonetype");
    RSS(ref_list_push(zone_type, zonetype), "save zonetype");
    REIS(1, fread(&packing, sizeof(int), 1, file), "packing");
    RSS(ref_list_push(zone_packing, packing), "save packing");
    REIS(1, fread(&location, sizeof(int), 1, file), "location");
    REIS(0, location, "only node data location plt implemented");
    REIS(1, fread(&neighbor, sizeof(int), 1, file), "neighbor");
    REIS(0, neighbor, "no face neighbor  plt implemented");

    /* there seem to be numvar extra zeros in USM3D volume files */
    /* assume numpts is first nonzero */
    miscellaneous = 0;
    for (i = 0; (i < (numvar + 1)) && (0 == miscellaneous); i++) {
      REIS(1, fread(&miscellaneous, sizeof(int), 1, file), "mystery");
    }
    numpts = miscellaneous;

    RSS(ref_list_push(zone_nnode, numpts), "save nnode");
    REIS(1, fread(&numelem, sizeof(int), 1, file), "numelem");
    RSS(ref_list_push(zone_nelem, numelem), "save nelem");

    for (i = 0; i < 3; i++) {
      REIS(1, fread(&dim, sizeof(int), 1, file), "dim");
      REIS(0, dim, "dim nonzero plt");
    }
    REIS(1, fread(&aux, sizeof(int), 1, file), "aux");
    REIS(0, aux, "aux nonzero plt");

    REIS(1, fread(&zonemarker, sizeof(float), 1, file), "zonemarker");
  }

  RWDS(357.0, (double)zonemarker, -1.0, "end of header marker expected");

  return REF_SUCCESS;
}